

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

void SHA1_transform(uint32_t *state,uchar *buffer)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  
  uVar1 = state[3];
  uVar2 = state[2];
  uVar3 = *state;
  uVar4 = state[1];
  uVar26 = *(uint *)buffer;
  uVar8 = *(uint *)(buffer + 4);
  uVar25 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
  uVar11 = (uVar3 << 5 | uVar3 >> 0x1b) + state[4] + ((uVar2 ^ uVar1) & uVar4 ^ uVar1) + uVar25 +
           0x5a827999;
  uVar7 = uVar4 << 0x1e | uVar4 >> 2;
  uVar29 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  uVar9 = ((uVar7 ^ uVar2) & uVar3 ^ uVar2) + uVar1 + uVar29 + 0x5a827999 +
          (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar15 = uVar3 << 0x1e | uVar3 >> 2;
  uVar26 = *(uint *)(buffer + 8);
  uVar6 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
  uVar12 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar10 = ((uVar15 ^ uVar7) & uVar11 ^ uVar7) + uVar6 + uVar2 + 0x5a827999 +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar26 = *(uint *)(buffer + 0xc);
  uVar11 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
  uVar8 = uVar7 + uVar11 + ((uVar12 ^ uVar15) & uVar9 ^ uVar15) + 0x5a827999 +
          (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar7 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar26 = *(uint *)(buffer + 0x10);
  uVar9 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
  uVar16 = uVar15 + uVar9 + ((uVar7 ^ uVar12) & uVar10 ^ uVar12) + 0x5a827999 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar15 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar26 = *(uint *)(buffer + 0x14);
  uVar10 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
  uVar13 = uVar12 + uVar10 + ((uVar15 ^ uVar7) & uVar8 ^ uVar7) + 0x5a827999 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar26 = *(uint *)(buffer + 0x18);
  uVar20 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
  uVar17 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar7 = uVar7 + uVar20 + ((uVar8 ^ uVar15) & uVar16 ^ uVar15) + 0x5a827999 +
          (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar26 = *(uint *)(buffer + 0x1c);
  uVar12 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
  uVar16 = uVar15 + uVar12 + ((uVar17 ^ uVar8) & uVar13 ^ uVar8) + 0x5a827999 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar14 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar26 = *(uint *)(buffer + 0x20);
  uVar15 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
  uVar8 = uVar8 + uVar15 + ((uVar14 ^ uVar17) & uVar7 ^ uVar17) + 0x5a827999 +
          (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar13 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar26 = *(uint *)(buffer + 0x24);
  uVar21 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
  uVar18 = uVar17 + uVar21 + ((uVar13 ^ uVar14) & uVar16 ^ uVar14) + 0x5a827999 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar17 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar26 = *(uint *)(buffer + 0x28);
  uVar31 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
  uVar7 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar8 = uVar14 + uVar31 + ((uVar17 ^ uVar13) & uVar8 ^ uVar13) + 0x5a827999 +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar26 = *(uint *)(buffer + 0x2c);
  uVar22 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
  uVar16 = uVar13 + uVar22 + ((uVar7 ^ uVar17) & uVar18 ^ uVar17) + 0x5a827999 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar19 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar26 = *(uint *)(buffer + 0x30);
  uVar23 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
  uVar14 = uVar17 + uVar23 + ((uVar19 ^ uVar7) & uVar8 ^ uVar7) + 0x5a827999 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar18 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar26 = *(uint *)(buffer + 0x34);
  uVar8 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
  uVar13 = uVar7 + uVar8 + ((uVar18 ^ uVar19) & uVar16 ^ uVar19) + 0x5a827999 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar17 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar26 = *(uint *)(buffer + 0x38);
  uVar7 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
  uVar19 = uVar19 + uVar7 + ((uVar17 ^ uVar18) & uVar14 ^ uVar18) + 0x5a827999 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar26 = *(uint *)(buffer + 0x3c);
  uVar14 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar24 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
  uVar18 = uVar18 + uVar24 + ((uVar14 ^ uVar17) & uVar13 ^ uVar17) + 0x5a827999 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar26 = uVar25 ^ uVar6 ^ uVar15 ^ uVar8;
  uVar16 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar27 = uVar26 << 1 | (uint)((int)uVar26 < 0);
  uVar17 = uVar17 + uVar27 + ((uVar16 ^ uVar14) & uVar19 ^ uVar14) + 0x5a827999 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar26 = uVar29 ^ uVar11 ^ uVar21 ^ uVar7;
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar30 = uVar26 << 1 | (uint)((int)uVar26 < 0);
  uVar14 = uVar14 + uVar30 + ((uVar19 ^ uVar16) & uVar18 ^ uVar16) + 0x5a827999 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar26 = uVar6 ^ uVar9 ^ uVar31 ^ uVar24;
  uVar6 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar13 = uVar26 << 1 | (uint)((int)uVar26 < 0);
  uVar26 = uVar16 + uVar13 + ((uVar6 ^ uVar19) & uVar17 ^ uVar19) + 0x5a827999 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar16 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar11 = uVar10 ^ uVar22 ^ uVar11 ^ uVar27;
  uVar25 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar19 = uVar19 + uVar25 + ((uVar16 ^ uVar6) & uVar14 ^ uVar6) + 0x5a827999 +
           (uVar26 * 0x20 | uVar26 >> 0x1b);
  uVar14 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar11 = uVar20 ^ uVar23 ^ uVar9 ^ uVar30;
  uVar32 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar18 = uVar6 + uVar32 + (uVar14 ^ uVar16 ^ uVar26) + 0x6ed9eba1 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar6 = uVar26 * 0x40000000 | uVar26 >> 2;
  uVar26 = uVar12 ^ uVar8 ^ uVar10 ^ uVar13;
  uVar17 = uVar26 << 1 | (uint)((int)uVar26 < 0);
  uVar11 = uVar16 + uVar17 + (uVar6 ^ uVar14 ^ uVar19) + 0x6ed9eba1 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar26 = uVar15 ^ uVar7 ^ uVar20 ^ uVar25;
  uVar9 = uVar26 << 1 | (uint)((int)uVar26 < 0);
  uVar16 = uVar14 + uVar9 + (uVar19 ^ uVar6 ^ uVar18) + 0x6ed9eba1 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar14 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar26 = uVar21 ^ uVar24 ^ uVar12 ^ uVar32;
  uVar26 = uVar26 << 1 | (uint)((int)uVar26 < 0);
  uVar10 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar6 = uVar6 + uVar26 + (uVar14 ^ uVar19 ^ uVar11) + 0x6ed9eba1 +
          (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar11 = uVar15 ^ uVar31 ^ uVar27 ^ uVar17;
  uVar29 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar18 = uVar19 + uVar29 + (uVar10 ^ uVar14 ^ uVar16) + 0x6ed9eba1 +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar12 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar11 = uVar21 ^ uVar22 ^ uVar30 ^ uVar9;
  uVar28 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar15 = uVar14 + uVar28 + (uVar12 ^ uVar10 ^ uVar6) + 0x6ed9eba1 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar11 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar6 = uVar31 ^ uVar23 ^ uVar13 ^ uVar26;
  uVar14 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar10 = uVar10 + uVar14 + (uVar11 ^ uVar12 ^ uVar18) + 0x6ed9eba1 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar19 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar6 = uVar22 ^ uVar8 ^ uVar25 ^ uVar29;
  uVar22 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar18 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar16 = uVar12 + uVar22 + (uVar19 ^ uVar11 ^ uVar15) + 0x6ed9eba1 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar6 = uVar23 ^ uVar7 ^ uVar32 ^ uVar28;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar11 = uVar11 + uVar6 + (uVar18 ^ uVar19 ^ uVar10) + 0x6ed9eba1 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar12 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar8 = uVar8 ^ uVar24 ^ uVar17 ^ uVar14;
  uVar15 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar20 = uVar19 + uVar15 + (uVar12 ^ uVar18 ^ uVar16) + 0x6ed9eba1 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar16 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar8 = uVar7 ^ uVar27 ^ uVar9 ^ uVar22;
  uVar8 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar19 = uVar18 + uVar8 + (uVar16 ^ uVar12 ^ uVar11) + 0x6ed9eba1 +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar10 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar7 = uVar24 ^ uVar30 ^ uVar26 ^ uVar6;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar21 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar12 = uVar12 + uVar7 + (uVar10 ^ uVar16 ^ uVar20) + 0x6ed9eba1 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar11 = uVar27 ^ uVar13 ^ uVar29 ^ uVar15;
  uVar23 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar18 = uVar16 + uVar23 + (uVar21 ^ uVar10 ^ uVar19) + 0x6ed9eba1 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar11 = uVar30 ^ uVar25 ^ uVar28 ^ uVar8;
  uVar11 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar10 = uVar10 + uVar11 + (uVar19 ^ uVar21 ^ uVar12) + 0x6ed9eba1 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar16 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar12 = uVar13 ^ uVar32 ^ uVar14 ^ uVar7;
  uVar27 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar20 = uVar21 + uVar27 + (uVar16 ^ uVar19 ^ uVar18) + 0x6ed9eba1 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar12 = uVar25 ^ uVar17 ^ uVar22 ^ uVar23;
  uVar25 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar12 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar19 = uVar19 + uVar25 + (uVar18 ^ uVar16 ^ uVar10) + 0x6ed9eba1 +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar10 = uVar32 ^ uVar9 ^ uVar6 ^ uVar11;
  uVar31 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar13 = uVar16 + uVar31 + (uVar12 ^ uVar18 ^ uVar20) + 0x6ed9eba1 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar21 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar10 = uVar17 ^ uVar26 ^ uVar15 ^ uVar27;
  uVar17 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar16 = uVar18 + uVar17 + (uVar21 ^ uVar12 ^ uVar19) + 0x6ed9eba1 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar20 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar9 = uVar9 ^ uVar29 ^ uVar8 ^ uVar25;
  uVar18 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar10 = uVar12 + uVar18 + (uVar20 ^ uVar21 ^ uVar13) + 0x6ed9eba1 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar12 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar26 = uVar26 ^ uVar28 ^ uVar7 ^ uVar31;
  uVar9 = uVar26 << 1 | (uint)((int)uVar26 < 0);
  uVar19 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar13 = uVar21 + uVar9 + (uVar12 ^ uVar20 ^ uVar16) + 0x6ed9eba1 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar26 = uVar29 ^ uVar14 ^ uVar23 ^ uVar17;
  uVar30 = uVar26 << 1 | (uint)((int)uVar26 < 0);
  uVar16 = uVar20 + uVar30 + (uVar10 & uVar19 | (uVar10 | uVar19) & uVar12) + -0x70e44324 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar10 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar26 = uVar28 ^ uVar22 ^ uVar11 ^ uVar18;
  uVar26 = uVar26 << 1 | (uint)((int)uVar26 < 0);
  uVar12 = uVar12 + uVar26 + (uVar13 & uVar10 | (uVar13 | uVar10) & uVar19) + -0x70e44324 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar20 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar13 = uVar14 ^ uVar6 ^ uVar27 ^ uVar9;
  uVar14 = uVar13 << 1 | (uint)((int)uVar13 < 0);
  uVar19 = uVar19 + uVar14 + (uVar16 & uVar20 | (uVar16 | uVar20) & uVar10) + -0x70e44324 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar21 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar13 = uVar22 ^ uVar15 ^ uVar25 ^ uVar30;
  uVar16 = uVar13 << 1 | (uint)((int)uVar13 < 0);
  uVar10 = uVar10 + uVar16 + (uVar12 & uVar21 | (uVar12 | uVar21) & uVar20) + -0x70e44324 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar13 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar6 = uVar6 ^ uVar8 ^ uVar31 ^ uVar26;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar22 = uVar20 + uVar6 + (uVar19 & uVar13 | (uVar19 | uVar13) & uVar21) + -0x70e44324 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar20 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar12 = uVar15 ^ uVar7 ^ uVar17 ^ uVar14;
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar21 = uVar21 + uVar12 + (uVar10 & uVar20 | (uVar10 | uVar20) & uVar13) + -0x70e44324 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar10 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar8 = uVar8 ^ uVar23 ^ uVar18 ^ uVar16;
  uVar19 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar15 = uVar13 + uVar19 + (uVar22 & uVar10 | (uVar22 | uVar10) & uVar20) + -0x70e44324 +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar22 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar8 = uVar7 ^ uVar11 ^ uVar9 ^ uVar6;
  uVar24 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar13 = uVar20 + uVar24 + (uVar21 & uVar22 | (uVar21 | uVar22) & uVar10) + -0x70e44324 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar20 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar8 = uVar23 ^ uVar27 ^ uVar30 ^ uVar12;
  uVar8 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar10 = uVar10 + uVar8 + (uVar15 & uVar20 | (uVar15 | uVar20) & uVar22) + -0x70e44324 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar15 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar7 = uVar11 ^ uVar25 ^ uVar26 ^ uVar19;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar22 = uVar22 + uVar7 + (uVar13 & uVar15 | (uVar13 | uVar15) & uVar20) + -0x70e44324 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar11 = uVar27 ^ uVar31 ^ uVar14 ^ uVar24;
  uVar11 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar21 = uVar20 + uVar11 + (uVar10 & uVar13 | (uVar10 | uVar13) & uVar15) + -0x70e44324 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar10 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar20 = uVar25 ^ uVar17 ^ uVar16 ^ uVar8;
  uVar29 = uVar20 << 1 | (uint)((int)uVar20 < 0);
  uVar15 = uVar15 + uVar29 + (uVar22 & uVar10 | (uVar22 | uVar10) & uVar13) + -0x70e44324 +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar22 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar20 = uVar31 ^ uVar18 ^ uVar6 ^ uVar7;
  uVar31 = uVar20 << 1 | (uint)((int)uVar20 < 0);
  uVar20 = uVar13 + uVar31 + (uVar21 & uVar22 | (uVar21 | uVar22) & uVar10) + -0x70e44324 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar13 = uVar17 ^ uVar9 ^ uVar12 ^ uVar11;
  uVar23 = uVar13 << 1 | (uint)((int)uVar13 < 0);
  uVar10 = uVar10 + uVar23 + (uVar15 & uVar21 | (uVar15 | uVar21) & uVar22) + -0x70e44324 +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar13 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar15 = uVar18 ^ uVar30 ^ uVar19 ^ uVar29;
  uVar15 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar17 = uVar22 + uVar15 + (uVar20 & uVar13 | (uVar20 | uVar13) & uVar21) + -0x70e44324 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar18 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar9 = uVar9 ^ uVar26 ^ uVar24 ^ uVar31;
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar20 = uVar21 + uVar9 + (uVar10 & uVar18 | (uVar10 | uVar18) & uVar13) + -0x70e44324 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar10 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar21 = uVar30 ^ uVar14 ^ uVar8 ^ uVar23;
  uVar28 = uVar21 << 1 | (uint)((int)uVar21 < 0);
  uVar13 = uVar13 + uVar28 + (uVar17 & uVar10 | (uVar17 | uVar10) & uVar18) + -0x70e44324 +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar21 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar26 = uVar26 ^ uVar16 ^ uVar7 ^ uVar15;
  uVar17 = uVar26 << 1 | (uint)((int)uVar26 < 0);
  uVar18 = uVar18 + uVar17 + (uVar20 & uVar21 | (uVar20 | uVar21) & uVar10) + -0x70e44324 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar26 = uVar14 ^ uVar6 ^ uVar11 ^ uVar9;
  uVar14 = uVar26 << 1 | (uint)((int)uVar26 < 0);
  uVar26 = uVar10 + uVar14 + (uVar13 & uVar20 | (uVar13 | uVar20) & uVar21) + -0x70e44324 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar10 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar13 = uVar16 ^ uVar12 ^ uVar29 ^ uVar28;
  uVar16 = uVar13 << 1 | (uint)((int)uVar13 < 0);
  uVar21 = uVar21 + uVar16 + (uVar18 & uVar10 | (uVar18 | uVar10) & uVar20) + -0x70e44324 +
           (uVar26 * 0x20 | uVar26 >> 0x1b);
  uVar13 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar6 = uVar6 ^ uVar19 ^ uVar31 ^ uVar17;
  uVar25 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar20 = uVar20 + uVar25 + (uVar13 ^ uVar10 ^ uVar26) + -0x359d3e2a +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar26 = uVar26 * 0x40000000 | uVar26 >> 2;
  uVar6 = uVar12 ^ uVar24 ^ uVar23 ^ uVar14;
  uVar12 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar22 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar10 = uVar10 + uVar12 + (uVar26 ^ uVar13 ^ uVar21) + -0x359d3e2a +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar6 = uVar19 ^ uVar8 ^ uVar15 ^ uVar16;
  uVar27 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar18 = uVar13 + uVar27 + (uVar22 ^ uVar26 ^ uVar20) + -0x359d3e2a +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar19 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar6 = uVar24 ^ uVar7 ^ uVar9 ^ uVar25;
  uVar24 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar6 = uVar26 + uVar24 + (uVar19 ^ uVar22 ^ uVar10) + -0x359d3e2a +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar13 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar26 = uVar8 ^ uVar11 ^ uVar28 ^ uVar12;
  uVar26 = uVar26 << 1 | (uint)((int)uVar26 < 0);
  uVar20 = uVar22 + uVar26 + (uVar13 ^ uVar19 ^ uVar18) + -0x359d3e2a +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar8 = uVar7 ^ uVar29 ^ uVar17 ^ uVar27;
  uVar8 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar10 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar19 = uVar19 + uVar8 + (uVar18 ^ uVar13 ^ uVar6) + -0x359d3e2a +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar7 = uVar11 ^ uVar31 ^ uVar14 ^ uVar24;
  uVar11 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar6 = uVar13 + uVar11 + (uVar10 ^ uVar18 ^ uVar20) + -0x359d3e2a +
          (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar21 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar7 = uVar29 ^ uVar23 ^ uVar16 ^ uVar26;
  uVar29 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar13 = uVar18 + uVar29 + (uVar21 ^ uVar10 ^ uVar19) + -0x359d3e2a +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar20 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar7 = uVar31 ^ uVar15 ^ uVar25 ^ uVar8;
  uVar30 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar7 = uVar10 + uVar30 + (uVar20 ^ uVar21 ^ uVar6) + -0x359d3e2a +
          (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar10 = uVar23 ^ uVar9 ^ uVar12 ^ uVar11;
  uVar22 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar19 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar21 = uVar21 + uVar22 + (uVar6 ^ uVar20 ^ uVar13) + -0x359d3e2a +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar10 = uVar15 ^ uVar28 ^ uVar27 ^ uVar29;
  uVar18 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar13 = uVar20 + uVar18 + (uVar19 ^ uVar6 ^ uVar7) + -0x359d3e2a +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar10 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar7 = uVar9 ^ uVar17 ^ uVar24 ^ uVar30;
  uVar15 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar9 = uVar6 + uVar15 + (uVar10 ^ uVar19 ^ uVar21) + -0x359d3e2a +
          (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar7 = uVar28 ^ uVar14 ^ uVar26 ^ uVar22;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar19 = uVar19 + uVar7 + (uVar21 ^ uVar10 ^ uVar13) + -0x359d3e2a +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar20 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar6 = uVar17 ^ uVar16 ^ uVar8 ^ uVar18;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar10 = uVar10 + uVar6 + (uVar20 ^ uVar21 ^ uVar9) + -0x359d3e2a +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar13 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar11 = uVar14 ^ uVar25 ^ uVar11 ^ uVar15;
  uVar11 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar21 = uVar21 + uVar11 + (uVar13 ^ uVar20 ^ uVar19) + -0x359d3e2a +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar17 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar7 = uVar16 ^ uVar12 ^ uVar29 ^ uVar7;
  uVar9 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar14 = uVar20 + uVar9 + (uVar17 ^ uVar13 ^ uVar10) + -0x359d3e2a +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar6 = uVar25 ^ uVar27 ^ uVar30 ^ uVar6;
  uVar10 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar16 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar6 = uVar13 + uVar16 + (uVar10 ^ uVar17 ^ uVar21) + -0x359d3e2a +
          (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar11 = uVar12 ^ uVar24 ^ uVar22 ^ uVar11;
  uVar12 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar7 = (uVar11 << 1 | (uint)((int)uVar11 < 0)) + uVar17 + (uVar12 ^ uVar10 ^ uVar14) +
          -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar9 = uVar26 ^ uVar27 ^ uVar18 ^ uVar9;
  uVar11 = uVar14 * 0x40000000 | uVar14 >> 2;
  iVar5 = (uVar9 << 1 | (uint)((int)uVar9 < 0)) + uVar10 + (uVar11 ^ uVar12 ^ uVar6) +
          (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar16 = uVar8 ^ uVar24 ^ uVar15 ^ uVar16;
  uVar8 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar26 = iVar5 + 0xca62c1d6;
  *state = (uVar16 << 1 | (uint)((int)uVar16 < 0)) + uVar3 + uVar12 + (uVar8 ^ uVar11 ^ uVar7) +
           -0x359d3e2a + (uVar26 * 0x20 | uVar26 >> 0x1b);
  state[1] = uVar4 + iVar5 + 0xca62c1d6;
  state[2] = (uVar7 * 0x40000000 | uVar7 >> 2) + uVar2;
  state[3] = uVar8 + uVar1;
  state[4] = uVar11 + state[4];
  return;
}

Assistant:

static void SHA1_transform(uint32_t state[5], const unsigned char buffer[64]) {
    uint32_t a, b, c, d, e;

    typedef union {
        unsigned char c[64];
        uint32_t l[16];
    } u;

    unsigned char w[64];
    u *block = (u *) w;

    memcpy(block, buffer, 64);

    a = state[0];
    b = state[1];
    c = state[2];
    d = state[3];
    e = state[4];

    static uint32_t endianness_indicator = 0x1;
    if (((unsigned char *) &endianness_indicator)[0]) {
        R0A_L( 0);
        R0E_L( 1);
        R0D_L( 2);
        R0C_L( 3);
        R0B_L( 4);
        R0A_L( 5);
        R0E_L( 6);
        R0D_L( 7);
        R0C_L( 8);
        R0B_L( 9);
        R0A_L(10);
        R0E_L(11);
        R0D_L(12);
        R0C_L(13);
        R0B_L(14);
        R0A_L(15);
    } else {
        R0A_B( 0);
        R0E_B( 1);
        R0D_B( 2);
        R0C_B( 3);
        R0B_B( 4);
        R0A_B( 5);
        R0E_B( 6);
        R0D_B( 7);
        R0C_B( 8);
        R0B_B( 9);
        R0A_B(10);
        R0E_B(11);
        R0D_B(12);
        R0C_B(13);
        R0B_B(14);
        R0A_B(15);
    }
    R1E(16);
    R1D(17);
    R1C(18);
    R1B(19);
    R2A(20);
    R2E(21);
    R2D(22);
    R2C(23);
    R2B(24);
    R2A(25);
    R2E(26);
    R2D(27);
    R2C(28);
    R2B(29);
    R2A(30);
    R2E(31);
    R2D(32);
    R2C(33);
    R2B(34);
    R2A(35);
    R2E(36);
    R2D(37);
    R2C(38);
    R2B(39);
    R3A(40);
    R3E(41);
    R3D(42);
    R3C(43);
    R3B(44);
    R3A(45);
    R3E(46);
    R3D(47);
    R3C(48);
    R3B(49);
    R3A(50);
    R3E(51);
    R3D(52);
    R3C(53);
    R3B(54);
    R3A(55);
    R3E(56);
    R3D(57);
    R3C(58);
    R3B(59);
    R4A(60);
    R4E(61);
    R4D(62);
    R4C(63);
    R4B(64);
    R4A(65);
    R4E(66);
    R4D(67);
    R4C(68);
    R4B(69);
    R4A(70);
    R4E(71);
    R4D(72);
    R4C(73);
    R4B(74);
    R4A(75);
    R4E(76);
    R4D(77);
    R4C(78);
    R4B(79);

    state[0] += a;
    state[1] += b;
    state[2] += c;
    state[3] += d;
    state[4] += e;
}